

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O2

int lsrkStep_TakeStepSSPs3(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  undefined1 (*pauVar1) [16];
  N_Vector *pp_Var2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ARKPostProcessFn p_Var8;
  ulong uVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar10;
  ulong uVar11;
  double __x;
  double __x_00;
  double dVar12;
  sunrealtype sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  ARKodeLSRKStepMem step_mem;
  
  *nflagPtr = 0;
  *dsmPtr = 0.0;
  iVar4 = lsrkStep_AccessStepMem(ark_mem,"lsrkStep_TakeStepSSPs3",&step_mem);
  if (iVar4 == 0) {
    pauVar1 = (undefined1 (*) [16])step_mem->cvals;
    pp_Var2 = step_mem->Xvecs;
    __x = (double)step_mem->req_stages;
    if (step_mem->req_stages < 1) {
      __x_00 = 0.0;
    }
    else if (__x < 0.0) {
      __x_00 = sqrt(__x);
    }
    else {
      __x_00 = SQRT(__x);
    }
    dVar12 = round(__x_00);
    if (ark_mem->fn_is_current == 0) {
      iVar4 = (*step_mem->fe)(ark_mem->tn,ark_mem->yn,ark_mem->fn,ark_mem->user_data);
      step_mem->nfe = step_mem->nfe + 1;
      if (iVar4 != 0) {
        return -8;
      }
      ark_mem->fn_is_current = 1;
    }
    dVar16 = 1.0 / (__x - __x_00);
    N_VLinearSum(0x3ff0000000000000,ark_mem->h * dVar16,ark_mem->yn,ark_mem->fn,ark_mem->ycur);
    if (ark_mem->fixedstep == 0) {
      N_VLinearSum(0x3ff0000000000000,ark_mem->h / __x,ark_mem->yn,ark_mem->fn,ark_mem->tempv1);
    }
    if ((ark_mem->ProcessStage == (ARKPostProcessFn)0x0) ||
       (iVar4 = (*ark_mem->ProcessStage)
                          (ark_mem->h * dVar16 + ark_mem->tn,ark_mem->ycur,ark_mem->user_data),
       iVar4 == 0)) {
      iVar5 = (int)dVar12;
      lVar3 = (long)((iVar5 + -2) * (iVar5 + -1));
      uVar10 = lVar3 / 2;
      uVar9 = lVar3 % 2 & 0xffffffff;
      uVar11 = uVar10 & 0xffffffff;
      for (iVar4 = 2; iVar4 <= (int)uVar10; iVar4 = iVar4 + 1) {
        iVar6 = (*step_mem->fe)((double)(iVar4 + -1) * dVar16 * ark_mem->h + ark_mem->tcur,
                                ark_mem->ycur,ark_mem->tempv3,ark_mem->user_data);
        step_mem->nfe = step_mem->nfe + 1;
        if (iVar6 < 0) {
          return -8;
        }
        if (iVar6 != 0) {
          return 9;
        }
        N_VLinearSum(0x3ff0000000000000,ark_mem->h * dVar16,ark_mem->ycur,ark_mem->tempv3,
                     ark_mem->ycur);
        uVar9 = extraout_RDX;
        if (ark_mem->fixedstep == 0) {
          N_VLinearSum(0x3ff0000000000000,ark_mem->h / __x,ark_mem->tempv1,ark_mem->tempv3,
                       ark_mem->tempv1);
          uVar9 = extraout_RDX_00;
        }
        if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
           (iVar6 = (*ark_mem->ProcessStage)
                              ((double)iVar4 * dVar16 * ark_mem->h + ark_mem->tcur,ark_mem->ycur,
                               ark_mem->user_data), uVar9 = extraout_RDX_01, iVar6 != 0))
        goto LAB_00146384;
      }
      N_VScale(0x3ff0000000000000,ark_mem->ycur,ark_mem->tempv2,uVar9);
      uVar10 = (long)((iVar5 + 1) * iVar5) / 2;
      do {
        iVar4 = (int)uVar11;
        if ((int)uVar10 + -1 <= iVar4) {
          iVar4 = (*step_mem->fe)(((__x_00 + 1.0) * __x_00 * 0.5 + -1.0) * dVar16 * ark_mem->h +
                                  ark_mem->tcur,ark_mem->ycur,ark_mem->tempv3,ark_mem->user_data);
          step_mem->nfe = step_mem->nfe + 1;
          if (iVar4 < 0) {
            return -8;
          }
          if (iVar4 != 0) {
            return 9;
          }
          dVar17 = __x_00 + -1.0;
          dVar12 = __x_00 + __x_00 + -1.0;
          *pp_Var2 = ark_mem->ycur;
          auVar14._8_8_ = __x_00;
          auVar14._0_8_ = dVar17;
          auVar15._8_8_ = dVar12;
          auVar15._0_8_ = dVar12;
          auVar15 = divpd(auVar14,auVar15);
          *pauVar1 = auVar15;
          pp_Var2[1] = ark_mem->tempv2;
          *(double *)pauVar1[1] = (dVar17 * dVar16 * ark_mem->h) / dVar12;
          pp_Var2[2] = ark_mem->tempv3;
          iVar4 = N_VLinearCombination(3,pauVar1,pp_Var2,ark_mem->ycur);
          if (iVar4 != 0) {
            return -0x1c;
          }
          uVar10 = uVar10 & 0xffffffff;
          if (ark_mem->fixedstep == 0) {
            N_VLinearSum(0x3ff0000000000000,ark_mem->h / __x,ark_mem->tempv1,ark_mem->tempv3,
                         ark_mem->tempv1);
          }
          p_Var8 = ark_mem->ProcessStage;
          if (p_Var8 == (ARKPostProcessFn)0x0) goto LAB_00146511;
          dVar12 = dVar17 * __x_00 * 0.5;
          do {
            iVar4 = (*p_Var8)(dVar12 * dVar16 * ark_mem->h + ark_mem->tcur,ark_mem->ycur,
                              ark_mem->user_data);
            if (iVar4 != 0) {
              return -0x26;
            }
LAB_00146511:
            do {
              if (step_mem->req_stages <= (int)uVar10) {
                if (ark_mem->fixedstep == 0) {
                  N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,ark_mem->ycur,ark_mem->tempv1);
                  sVar13 = (sunrealtype)N_VWrmsNorm(ark_mem->tempv1,ark_mem->ewt);
                  *dsmPtr = sVar13;
                  return 0;
                }
                return 0;
              }
              uVar7 = (int)uVar10 + 1;
              uVar10 = (ulong)uVar7;
              dVar12 = (double)(int)uVar7 - __x_00;
              iVar4 = (*step_mem->fe)((dVar12 + -1.0) * dVar16 * ark_mem->h + ark_mem->tcur,
                                      ark_mem->ycur,ark_mem->tempv3,ark_mem->user_data);
              step_mem->nfe = step_mem->nfe + 1;
              if (iVar4 < 0) {
                return -8;
              }
              if (iVar4 != 0) {
                return 9;
              }
              N_VLinearSum(0x3ff0000000000000,ark_mem->h * dVar16,ark_mem->ycur,ark_mem->tempv3,
                           ark_mem->ycur);
              if (ark_mem->fixedstep == 0) {
                N_VLinearSum(0x3ff0000000000000,ark_mem->h / __x,ark_mem->tempv1,ark_mem->tempv3,
                             ark_mem->tempv1);
              }
              p_Var8 = ark_mem->ProcessStage;
            } while ((p_Var8 == (ARKPostProcessFn)0x0) || (step_mem->req_stages <= (int)uVar7));
          } while( true );
        }
        uVar11 = (ulong)(iVar4 + 1U);
        iVar5 = (*step_mem->fe)((double)iVar4 * dVar16 * ark_mem->h + ark_mem->tcur,ark_mem->ycur,
                                ark_mem->tempv3,ark_mem->user_data);
        step_mem->nfe = step_mem->nfe + 1;
        if (iVar5 < 0) {
          return -8;
        }
        if (iVar5 != 0) {
          return 9;
        }
        N_VLinearSum(0x3ff0000000000000,ark_mem->h * dVar16,ark_mem->ycur,ark_mem->tempv3,
                     ark_mem->ycur);
        if (ark_mem->fixedstep == 0) {
          N_VLinearSum(0x3ff0000000000000,ark_mem->h / __x,ark_mem->tempv1,ark_mem->tempv3,
                       ark_mem->tempv1);
        }
      } while ((ark_mem->ProcessStage == (ARKPostProcessFn)0x0) ||
              (iVar4 = (*ark_mem->ProcessStage)
                                 ((double)(int)(iVar4 + 1U) * dVar16 * ark_mem->h + ark_mem->tcur,
                                  ark_mem->ycur,ark_mem->user_data), iVar4 == 0));
LAB_00146384:
      iVar4 = -0x26;
    }
    else {
      iVar4 = -0x26;
    }
  }
  return iVar4;
}

Assistant:

int lsrkStep_TakeStepSSPs3(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  int retval;
  ARKodeLSRKStepMem step_mem;

  /* initialize algebraic solver convergence flag to success,
     temporal error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr   = ZERO;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  sunrealtype* cvals = step_mem->cvals;
  N_Vector* Xvecs    = step_mem->Xvecs;

  sunrealtype rs  = (sunrealtype)step_mem->req_stages;
  sunrealtype rn  = SUNRsqrt(rs);
  sunrealtype rat = ONE / (rs - rn);
  int in          = (int)SUNRround(rn);

  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 0,
             ark_mem->tcur);
  SUNLogExtraDebugVec(ARK_LOGGER, "stage", ark_mem->yn, "z_0(:) =");

  /* The method is not FSAL. Therefore, fn ​is computed at the beginning
     of the step unless ARKODE updated fn. */
  if (!ark_mem->fn_is_current)
  {
    retval = step_mem->fe(ark_mem->tn, ark_mem->yn, ark_mem->fn,
                          ark_mem->user_data);
    step_mem->nfe++;
    if (retval != ARK_SUCCESS)
    {
      SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return (ARK_RHSFUNC_FAIL);
    }
    ark_mem->fn_is_current = SUNTRUE;
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 1,
             ark_mem->tn + rat * ark_mem->h);

  N_VLinearSum(ONE, ark_mem->yn, ark_mem->h * rat, ark_mem->fn, ark_mem->ycur);
  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->yn, ark_mem->h / rs, ark_mem->fn, ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tn + ark_mem->h * rat,
                                   ark_mem->ycur, ark_mem->user_data);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      return ARK_POSTPROCESS_STAGE_FAIL;
    }
  }

  /* Evaluate stages j = 2,...,step_mem->req_stages */
  for (int j = 2; j <= ((in - 1) * (in - 2) / 2); j++)
  {
    retval =
      step_mem->fe(ark_mem->tcur + ((sunrealtype)j - ONE) * rat * ark_mem->h,
                   ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + j * rat * ark_mem->h);

    N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * rat, ark_mem->tempv3,
                 ark_mem->ycur);
    if (!ark_mem->fixedstep)
    {
      N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                   ark_mem->tempv1);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur + j * rat * ark_mem->h,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }
  }

  N_VScale(ONE, ark_mem->ycur, ark_mem->tempv2);

  for (int j = ((in - 1) * (in - 2) / 2 + 1); j <= (in * (in + 1) / 2 - 1); j++)
  {
    retval =
      step_mem->fe(ark_mem->tcur + ((sunrealtype)j - ONE) * rat * ark_mem->h,
                   ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + j * rat * ark_mem->h);

    N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * rat, ark_mem->tempv3,
                 ark_mem->ycur);
    if (!ark_mem->fixedstep)
    {
      N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                   ark_mem->tempv1);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur + j * rat * ark_mem->h,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }
  }

  retval = step_mem->fe(ark_mem->tcur +
                          rat * (rn * (rn + ONE) / TWO - ONE) * ark_mem->h,
                        ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
  step_mem->nfe++;

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                      "F_%i(:) =", in * (in + 1) / 2 - 1);
  SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
               "status = failed rhs eval, retval = %i", retval);

  if (retval < 0) { return ARK_RHSFUNC_FAIL; }
  if (retval > 0) { return RHSFUNC_RECVR; }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G,
             (in * (in + 1) / 2),
             ark_mem->tn + (in * (in - 1) / 2) * rat * ark_mem->h);

  cvals[0] = (rn - ONE) / (TWO * rn - ONE);
  Xvecs[0] = ark_mem->ycur;
  cvals[1] = rn / (TWO * rn - ONE);
  Xvecs[1] = ark_mem->tempv2;
  cvals[2] = (rn - ONE) * rat * ark_mem->h / (TWO * rn - ONE);
  Xvecs[2] = ark_mem->tempv3;

  retval = N_VLinearCombination(3, cvals, Xvecs, ark_mem->ycur);
  if (retval != 0)
  {
    SUNLogInfo(ARK_LOGGER, "end-stage",
               "status = failed vector op, retval = %i", retval);
    return ARK_VECTOROP_ERR;
  }

  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                 ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tcur +
                                     rat * (rn * (rn - ONE) / TWO) * ark_mem->h,
                                   ark_mem->ycur, ark_mem->user_data);
    if (retval != 0) { return ARK_POSTPROCESS_STAGE_FAIL; }
  }

  for (int j = (in * (in + 1) / 2 + 1); j <= step_mem->req_stages; j++)
  {
    retval = step_mem->fe(ark_mem->tcur +
                            ((sunrealtype)j - rn - ONE) * rat * ark_mem->h,
                          ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + ((sunrealtype)j - rn) * rat * ark_mem->h);

    N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * rat, ark_mem->tempv3,
                 ark_mem->ycur);
    if (!ark_mem->fixedstep)
    {
      N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                   ark_mem->tempv1);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL && j < step_mem->req_stages)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur +
                                       ((sunrealtype)j - rn) * rat * ark_mem->h,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }
  }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");
  SUNLogInfo(ARK_LOGGER, "begin-compute-embedding", "");

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    SUNLogExtraDebugVec(ARK_LOGGER, "embedded solution", ark_mem->tempv1,
                        "y_embedded(:) =");
    N_VLinearSum(ONE, ark_mem->ycur, -ONE, ark_mem->tempv1, ark_mem->tempv1);
    *dsmPtr = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);
  }

  SUNLogInfo(ARK_LOGGER, "end-compute-embedding", "status = success");

  return ARK_SUCCESS;
}